

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall QWidgetWindow::handleGestureEvent(QWidgetWindow *this,QNativeGestureEvent *e)

{
  Data *pDVar1;
  bool bVar2;
  QWidget *this_00;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  double dVar4;
  undefined1 auVar5 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QApplication::activePopupWidget();
  if (this_00 == (QWidget *)0x0) {
    auVar5 = QEventPoint::globalPosition();
    dVar4 = (double)((ulong)auVar5._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._0_8_;
    bVar2 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    local_28.xp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar4);
    dVar4 = (double)((ulong)auVar5._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._8_8_;
    bVar2 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    local_28.yp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar4);
    pQVar3 = QApplication::widgetAt(&local_28);
    if (pQVar3 == (QWidget *)0x0) {
      pDVar1 = (this->m_widget).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QWidget *)0x0;
      }
      else {
        pQVar3 = (QWidget *)(this->m_widget).wp.value;
      }
    }
  }
  else {
    pQVar3 = QWidget::focusWidget(this_00);
    if (pQVar3 == (QWidget *)0x0) {
      pQVar3 = this_00;
    }
  }
  QCoreApplication::forwardEvent(&pQVar3->super_QObject,(QEvent *)e,(QEvent *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleGestureEvent(QNativeGestureEvent *e)
{
    // copy-pasted code to find correct widget follows:
    QObject *receiver = nullptr;
    if (auto *popup = QApplication::activePopupWidget()) {
        QWidget *popupFocusWidget = popup->focusWidget();
        receiver = popupFocusWidget ? popupFocusWidget : popup;
    }
    if (!receiver)
        receiver = QApplication::widgetAt(e->globalPosition().toPoint());
    if (!receiver)
        receiver = m_widget; // last resort

    QApplication::forwardEvent(receiver, e);
}